

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

bool SignPSBTInput(SigningProvider *provider,PartiallySignedTransaction *psbt,int index,
                  PrecomputedTransactionData *txdata,int sighash,SignatureData *out_sigdata,
                  bool finalize)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  element_type *peVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  PartiallySignedTransaction psbt_00;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  PSBTInput *this;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  COutPoint prevout;
  SignatureData sigdata;
  undefined4 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffab9;
  undefined1 in_stack_fffffffffffffaba;
  undefined1 in_stack_fffffffffffffabb;
  undefined1 in_stack_fffffffffffffabc;
  undefined1 in_stack_fffffffffffffabd;
  undefined1 in_stack_fffffffffffffabe;
  undefined1 in_stack_fffffffffffffabf;
  undefined1 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac1;
  undefined1 in_stack_fffffffffffffac2;
  undefined1 in_stack_fffffffffffffac3;
  undefined1 in_stack_fffffffffffffac4;
  undefined1 in_stack_fffffffffffffac5;
  undefined1 in_stack_fffffffffffffac6;
  undefined1 in_stack_fffffffffffffac7;
  undefined1 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffac9;
  undefined1 in_stack_fffffffffffffaca;
  undefined1 in_stack_fffffffffffffacb;
  undefined1 in_stack_fffffffffffffacc;
  undefined1 in_stack_fffffffffffffacd;
  undefined1 in_stack_ffffffffffffface;
  undefined1 in_stack_fffffffffffffacf;
  undefined1 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad1;
  undefined1 in_stack_fffffffffffffad2;
  undefined1 in_stack_fffffffffffffad3;
  undefined1 in_stack_fffffffffffffad4;
  undefined1 in_stack_fffffffffffffad5;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 in_stack_fffffffffffffad7;
  undefined4 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadc [44];
  CAmount in_stack_fffffffffffffb08;
  long lVar16;
  undefined8 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb18 [20];
  uint in_stack_fffffffffffffb2c;
  bool in_stack_fffffffffffffb30;
  bool in_stack_fffffffffffffb31;
  undefined1 in_stack_fffffffffffffb32 [110];
  _Rb_tree_node_base local_408;
  size_t local_3e8;
  bool local_378;
  _Rb_tree_node_base local_368;
  size_t local_348;
  _Rb_tree_node_base local_338;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  _Rb_tree_node_base local_2f0;
  size_t local_2d0;
  _Rb_tree_node_base local_2c0;
  size_t local_2a0;
  _Rb_tree_node_base local_290;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  uchar local_230 [56];
  _Rb_tree_node_base local_1f8;
  size_t local_1d8;
  _Rb_tree_node_base local_1c8;
  size_t local_1a8;
  _Rb_tree_node_base local_198;
  size_t local_178;
  _Rb_tree_node_base local_168;
  size_t local_148;
  PartiallySignedTransaction local_140;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = (ulong)index;
  pPVar3 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = ((long)(psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pPVar3 >> 5) * -0x70a3d70a3d70a3d7;
  if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar10 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,uVar13);
      if (0x1c < in_stack_fffffffffffffb2c) {
        free((void *)in_stack_fffffffffffffb10);
      }
      SignatureData::~SignatureData((SignatureData *)&stack0xfffffffffffffb30);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar10);
      }
    }
    goto LAB_0035b152;
  }
  PartiallySignedTransaction::PartiallySignedTransaction(&local_140,psbt);
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._8_4_ = in_stack_fffffffffffffaa0;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)out_sigdata;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._12_4_ = sighash;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)provider;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)txdata;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._32_1_ = in_stack_fffffffffffffab8;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._33_1_ = in_stack_fffffffffffffab9;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._34_1_ = in_stack_fffffffffffffaba;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._35_1_ = in_stack_fffffffffffffabb;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._36_1_ = in_stack_fffffffffffffabc;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._37_1_ = in_stack_fffffffffffffabd;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._38_1_ = in_stack_fffffffffffffabe;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._39_1_ = in_stack_fffffffffffffabf;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._40_1_ = in_stack_fffffffffffffac0;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._41_1_ = in_stack_fffffffffffffac1;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._42_1_ = in_stack_fffffffffffffac2;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._43_1_ = in_stack_fffffffffffffac3;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._44_1_ = in_stack_fffffffffffffac4;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._45_1_ = in_stack_fffffffffffffac5;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._46_1_ = in_stack_fffffffffffffac6;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._47_1_ = in_stack_fffffffffffffac7;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.version._0_1_ =
       in_stack_fffffffffffffac8;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.version._1_1_ =
       in_stack_fffffffffffffac9;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.version._2_1_ =
       in_stack_fffffffffffffaca;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.version._3_1_ =
       in_stack_fffffffffffffacb;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.nLockTime._0_1_ =
       in_stack_fffffffffffffacc;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.nLockTime._1_1_ =
       in_stack_fffffffffffffacd;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.nLockTime._2_1_ =
       in_stack_ffffffffffffface;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.nLockTime._3_1_ =
       in_stack_fffffffffffffacf;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_engaged = (bool)in_stack_fffffffffffffad0;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._57_1_ = in_stack_fffffffffffffad1;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._58_1_ = in_stack_fffffffffffffad2;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._59_1_ = in_stack_fffffffffffffad3;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._60_1_ = in_stack_fffffffffffffad4;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._61_1_ = in_stack_fffffffffffffad5;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._62_1_ = in_stack_fffffffffffffad6;
  psbt_00.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._63_1_ = in_stack_fffffffffffffad7;
  psbt_00.m_xpubs._M_t._M_impl._0_4_ = in_stack_fffffffffffffad8;
  psbt_00.m_xpubs._M_t._M_impl._4_44_ = in_stack_fffffffffffffadc;
  psbt_00.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb08;
  psbt_00.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb10;
  psbt_00._128_20_ = in_stack_fffffffffffffb18;
  psbt_00.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffb2c;
  psbt_00.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffffb30;
  psbt_00.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = in_stack_fffffffffffffb31;
  psbt_00._154_110_ = in_stack_fffffffffffffb32;
  bVar8 = PSBTInputSignedAndVerified
                    (psbt_00,(uint)&local_140,(PrecomputedTransactionData *)(ulong)(uint)index);
  std::
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  ::~_Rb_tree(&local_140.m_proprietary._M_t);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&local_140.unknown._M_t);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&local_140.outputs);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&local_140.inputs);
  std::
  _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::~_Rb_tree(&local_140.m_xpubs._M_t);
  std::_Optional_payload_base<CMutableTransaction>::_M_reset
            ((_Optional_payload_base<CMutableTransaction> *)&local_140);
  bVar9 = true;
  if (!bVar8) {
    this = pPVar3 + uVar13;
    local_408._M_color = _S_red;
    local_408._M_parent = (_Base_ptr)0x0;
    memset(&stack0xfffffffffffffb38,0,0xb8);
    local_3e8 = 0;
    local_378 = false;
    local_368._M_left = &local_368;
    local_368._M_color = _S_red;
    local_368._M_parent = (_Base_ptr)0x0;
    local_348 = 0;
    local_338._M_left = &local_338;
    local_338._M_color = _S_red;
    local_338._M_parent = (_Base_ptr)0x0;
    local_2f0._M_left = &local_2f0;
    local_2f0._M_color = _S_red;
    local_2f0._M_parent = (_Base_ptr)0x0;
    local_318 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    local_2d0 = 0;
    local_2c0._M_left = &local_2c0;
    local_2c0._M_color = _S_red;
    local_2c0._M_parent = (_Base_ptr)0x0;
    local_2a0 = 0;
    local_290._M_left = &local_290;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_1f8._M_left = &local_1f8;
    local_1f8._M_color = _S_red;
    local_1f8._M_parent = (_Base_ptr)0x0;
    local_230[0x20] = '\0';
    local_230[0x21] = '\0';
    local_230[0x22] = '\0';
    local_230[0x23] = '\0';
    local_230[0x24] = '\0';
    local_230[0x25] = '\0';
    local_230[0x26] = '\0';
    local_230[0x27] = '\0';
    local_230[0x28] = '\0';
    local_230[0x29] = '\0';
    local_230[0x2a] = '\0';
    local_230[0x2b] = '\0';
    local_230[0x10] = '\0';
    local_230[0x11] = '\0';
    local_230[0x12] = '\0';
    local_230[0x13] = '\0';
    local_230[0x14] = '\0';
    local_230[0x15] = '\0';
    local_230[0x16] = '\0';
    local_230[0x17] = '\0';
    local_230[0x18] = '\0';
    local_230[0x19] = '\0';
    local_230[0x1a] = '\0';
    local_230[0x1b] = '\0';
    local_230[0x1c] = '\0';
    local_230[0x1d] = '\0';
    local_230[0x1e] = '\0';
    local_230[0x1f] = '\0';
    local_230[0] = '\0';
    local_230[1] = '\0';
    local_230[2] = '\0';
    local_230[3] = '\0';
    local_230[4] = '\0';
    local_230[5] = '\0';
    local_230[6] = '\0';
    local_230[7] = '\0';
    local_230[8] = '\0';
    local_230[9] = '\0';
    local_230[10] = '\0';
    local_230[0xb] = '\0';
    local_230[0xc] = '\0';
    local_230[0xd] = '\0';
    local_230[0xe] = '\0';
    local_230[0xf] = '\0';
    local_240 = (undefined1  [16])0x0;
    local_250 = (undefined1  [16])0x0;
    local_260 = (undefined1  [16])0x0;
    local_270 = (undefined1  [16])0x0;
    local_1d8 = 0;
    local_1c8._M_left = &local_1c8;
    local_1c8._M_color = _S_red;
    local_1c8._M_parent = (_Base_ptr)0x0;
    local_1a8 = 0;
    local_198._M_left = &local_198;
    local_198._M_color = _S_red;
    local_198._M_parent = (_Base_ptr)0x0;
    local_178 = 0;
    local_168._M_left = &local_168;
    local_168._M_color = _S_red;
    local_168._M_parent = (_Base_ptr)0x0;
    local_148 = 0;
    local_408._M_left = &local_408;
    local_408._M_right = &local_408;
    local_368._M_right = local_368._M_left;
    local_338._M_right = local_338._M_left;
    local_2f0._M_right = local_2f0._M_left;
    local_2c0._M_right = local_2c0._M_left;
    local_290._M_right = local_290._M_left;
    local_1f8._M_right = local_1f8._M_left;
    local_1c8._M_right = local_1c8._M_left;
    local_198._M_right = local_198._M_left;
    local_168._M_right = local_168._M_left;
    PSBTInput::FillSignatureData(this,(SignatureData *)&stack0xfffffffffffffb30);
    CTxOut::CTxOut((CTxOut *)&stack0xfffffffffffffb08);
    peVar4 = (this->non_witness_utxo).
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      lVar16 = (this->witness_utxo).nValue;
      if (lVar16 != -1) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xfffffffffffffb10,
                   &(this->witness_utxo).scriptPubKey.super_CScriptBase);
        goto LAB_0035af1e;
      }
LAB_0035b062:
      bVar9 = false;
    }
    else {
      lVar16 = *(long *)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                         _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>
                         .super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
      lVar11 = uVar13 * 0x68;
      uVar10 = *(undefined8 *)(lVar16 + lVar11);
      uVar5 = ((undefined8 *)(lVar16 + lVar11))[1];
      puVar2 = (undefined8 *)(lVar16 + 0x10 + lVar11);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      uVar12 = (ulong)*(uint *)(lVar16 + 0x20 + lVar11);
      lVar16 = (long)(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar13 = ((long)*(pointer *)
                       ((long)&(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data + 8) - lVar16 >> 3) *
               -0x3333333333333333;
      if ((uVar13 < uVar12 || uVar13 - uVar12 == 0) ||
         (auVar15[0] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                   0x10) == (uchar)uVar6),
         auVar15[1] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x11) == (uchar)((ulong)uVar6 >> 8)),
         auVar15[2] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x12) == (uchar)((ulong)uVar6 >> 0x10)),
         auVar15[3] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x13) == (uchar)((ulong)uVar6 >> 0x18)),
         auVar15[4] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x14) == (uchar)((ulong)uVar6 >> 0x20)),
         auVar15[5] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x15) == (uchar)((ulong)uVar6 >> 0x28)),
         auVar15[6] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x16) == (uchar)((ulong)uVar6 >> 0x30)),
         auVar15[7] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x17) == (uchar)((ulong)uVar6 >> 0x38)),
         auVar15[8] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x18) == (uchar)uVar7),
         auVar15[9] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                  0x19) == (uchar)((ulong)uVar7 >> 8)),
         auVar15[10] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                   0x1a) == (uchar)((ulong)uVar7 >> 0x10)),
         auVar15[0xb] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0x1b) == (uchar)((ulong)uVar7 >> 0x18)),
         auVar15[0xc] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0x1c) == (uchar)((ulong)uVar7 >> 0x20)),
         auVar15[0xd] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0x1d) == (uchar)((ulong)uVar7 >> 0x28)),
         auVar15[0xe] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0x1e) == (uchar)((ulong)uVar7 >> 0x30)),
         auVar15[0xf] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0x1f) == (uchar)((ulong)uVar7 >> 0x38)),
         auVar14[0] = -((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                       (char)uVar10),
         auVar14[1] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 1)
                       == (uchar)((ulong)uVar10 >> 8)),
         auVar14[2] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 2)
                       == (uchar)((ulong)uVar10 >> 0x10)),
         auVar14[3] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 3)
                       == (uchar)((ulong)uVar10 >> 0x18)),
         auVar14[4] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 4)
                       == (uchar)((ulong)uVar10 >> 0x20)),
         auVar14[5] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 5)
                       == (uchar)((ulong)uVar10 >> 0x28)),
         auVar14[6] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 6)
                       == (uchar)((ulong)uVar10 >> 0x30)),
         auVar14[7] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 7)
                       == (uchar)((ulong)uVar10 >> 0x38)),
         auVar14[8] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 8)
                       == (uchar)uVar5),
         auVar14[9] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data + 9)
                       == (uchar)((ulong)uVar5 >> 8)),
         auVar14[10] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                   10) == (uchar)((ulong)uVar5 >> 0x10)),
         auVar14[0xb] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0xb) == (uchar)((ulong)uVar5 >> 0x18)),
         auVar14[0xc] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0xc) == (uchar)((ulong)uVar5 >> 0x20)),
         auVar14[0xd] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0xd) == (uchar)((ulong)uVar5 >> 0x28)),
         auVar14[0xe] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0xe) == (uchar)((ulong)uVar5 >> 0x30)),
         auVar14[0xf] = -(*(uchar *)((long)&(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data +
                                    0xf) == (uchar)((ulong)uVar5 >> 0x38)),
         auVar14 = auVar14 & auVar15,
         (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0035b062;
      plVar1 = (long *)(lVar16 + uVar12 * 0x28);
      lVar16 = *plVar1;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xfffffffffffffb10,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(plVar1 + 1));
LAB_0035af1e:
      bVar8 = false;
      if (txdata == (PrecomputedTransactionData *)0x0) {
        bVar9 = ProduceSignature(provider,DUMMY_SIGNATURE_CREATOR,
                                 (CScript *)&stack0xfffffffffffffb10,
                                 (SignatureData *)&stack0xfffffffffffffb30);
      }
      else {
        MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                  ((MutableTransactionSignatureCreator *)&stack0xfffffffffffffab8,
                   (CMutableTransaction *)psbt,index,(CAmount *)&stack0xfffffffffffffb08,txdata,
                   sighash);
        bVar9 = ProduceSignature(provider,(BaseSignatureCreator *)&stack0xfffffffffffffab8,
                                 (CScript *)&stack0xfffffffffffffb10,
                                 (SignatureData *)&stack0xfffffffffffffb30);
      }
      if ((peVar4 == (element_type *)0x0) && (bVar8 != true)) goto LAB_0035b062;
      PSBTInput::FromSignatureData(this,(SignatureData *)&stack0xfffffffffffffb30);
      if (bVar8 == true) {
        (this->witness_utxo).nValue = lVar16;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(this->witness_utxo).scriptPubKey.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xfffffffffffffb10);
      }
      if (out_sigdata != (SignatureData *)0x0) {
        std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                  (&out_sigdata->missing_pubkeys,
                   (vector<CKeyID,_std::allocator<CKeyID>_> *)(local_270 + 8));
        std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                  (&out_sigdata->missing_sigs,(vector<CKeyID,_std::allocator<CKeyID>_> *)local_250);
        *(undefined4 *)
         ((out_sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 0x10) =
             local_230._8_4_;
        *(undefined8 *)(out_sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems =
             local_240._8_8_;
        *(undefined8 *)
         ((out_sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 8) =
             local_230._0_8_;
        *(ulong *)(out_sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems =
             CONCAT44(local_230._16_4_,local_230._12_4_);
        *(undefined8 *)
         ((out_sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 8) =
             local_230._20_8_;
        *(ulong *)((out_sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems +
                  0x10) = CONCAT44(local_230._32_4_,local_230._28_4_);
        *(undefined8 *)
         ((out_sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x18) =
             local_230._36_8_;
      }
    }
    if (0x1c < in_stack_fffffffffffffb2c) {
      free((void *)in_stack_fffffffffffffb10);
    }
    SignatureData::~SignatureData((SignatureData *)&stack0xfffffffffffffb30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
LAB_0035b152:
  __stack_chk_fail();
}

Assistant:

bool SignPSBTInput(const SigningProvider& provider, PartiallySignedTransaction& psbt, int index, const PrecomputedTransactionData* txdata, int sighash,  SignatureData* out_sigdata, bool finalize)
{
    PSBTInput& input = psbt.inputs.at(index);
    const CMutableTransaction& tx = *psbt.tx;

    if (PSBTInputSignedAndVerified(psbt, index, txdata)) {
        return true;
    }

    // Fill SignatureData with input info
    SignatureData sigdata;
    input.FillSignatureData(sigdata);

    // Get UTXO
    bool require_witness_sig = false;
    CTxOut utxo;

    if (input.non_witness_utxo) {
        // If we're taking our information from a non-witness UTXO, verify that it matches the prevout.
        COutPoint prevout = tx.vin[index].prevout;
        if (prevout.n >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout.n];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
        // When we're taking our information from a witness UTXO, we can't verify it is actually data from
        // the output being spent. This is safe in case a witness signature is produced (which includes this
        // information directly in the hash), but not for non-witness signatures. Remember that we require
        // a witness signature in this situation.
        require_witness_sig = true;
    } else {
        return false;
    }

    sigdata.witness = false;
    bool sig_complete;
    if (txdata == nullptr) {
        sig_complete = ProduceSignature(provider, DUMMY_SIGNATURE_CREATOR, utxo.scriptPubKey, sigdata);
    } else {
        MutableTransactionSignatureCreator creator(tx, index, utxo.nValue, txdata, sighash);
        sig_complete = ProduceSignature(provider, creator, utxo.scriptPubKey, sigdata);
    }
    // Verify that a witness signature was produced in case one was required.
    if (require_witness_sig && !sigdata.witness) return false;

    // If we are not finalizing, set sigdata.complete to false to not set the scriptWitness
    if (!finalize && sigdata.complete) sigdata.complete = false;

    input.FromSignatureData(sigdata);

    // If we have a witness signature, put a witness UTXO.
    if (sigdata.witness) {
        input.witness_utxo = utxo;
        // We can remove the non_witness_utxo if and only if there are no non-segwit or segwit v0
        // inputs in this transaction. Since this requires inspecting the entire transaction, this
        // is something for the caller to deal with (i.e. FillPSBT).
    }

    // Fill in the missing info
    if (out_sigdata) {
        out_sigdata->missing_pubkeys = sigdata.missing_pubkeys;
        out_sigdata->missing_sigs = sigdata.missing_sigs;
        out_sigdata->missing_redeem_script = sigdata.missing_redeem_script;
        out_sigdata->missing_witness_script = sigdata.missing_witness_script;
    }

    return sig_complete;
}